

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O2

_Bool find_rotzoom(Correspondence *points,int *indices,int num_indices,double *params)

{
  Correspondence *pCVar1;
  double b;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  double local_e8;
  double dStack_e0;
  double y [4];
  double mat [16];
  
  mat[0] = 0.0;
  mat[1] = 0.0;
  mat[2] = 0.0;
  mat[3] = 0.0;
  mat[4] = 0.0;
  mat[5] = 0.0;
  mat[6] = 0.0;
  mat[7] = 0.0;
  mat[8] = 0.0;
  mat[9] = 0.0;
  mat[10] = 0.0;
  mat[0xb] = 0.0;
  mat[0xc] = 0.0;
  mat[0xd] = 0.0;
  mat[0xe] = 0.0;
  mat[0xf] = 0.0;
  y[0] = 0.0;
  y[1] = 0.0;
  y[2] = 0.0;
  y[3] = 0.0;
  uVar4 = 0;
  uVar3 = (ulong)(uint)num_indices;
  if (num_indices < 1) {
    uVar3 = uVar4;
  }
  local_f8 = 0;
  uStack_f4 = 0;
  uStack_f0 = 0;
  uStack_ec = 0x3ff00000;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = indices[uVar4];
    b = points[iVar2].ry;
    local_118 = 1.0;
    uStack_110 = 0;
    pCVar1 = points + iVar2;
    local_e8 = pCVar1->x;
    dStack_e0 = pCVar1->y;
    local_108._0_8_ = pCVar1->x;
    local_108._8_8_ = pCVar1->y;
    least_squares_accumulate(mat,y,&local_118,points[iVar2].rx,4);
    local_118 = (double)CONCAT44(uStack_f4,local_f8);
    uStack_110 = CONCAT44(uStack_ec,uStack_f0);
    local_108._8_4_ = SUB84(local_e8,0);
    local_108._0_8_ = dStack_e0;
    local_108._12_4_ = (uint)((ulong)local_e8 >> 0x20) ^ 0x80000000;
    least_squares_accumulate(mat,y,&local_118,b,4);
  }
  iVar2 = least_squares_solve(mat,y,params,4);
  if (iVar2 != 0) {
    params[4] = -params[3];
    params[5] = params[2];
  }
  return iVar2 != 0;
}

Assistant:

static bool find_rotzoom(const Correspondence *points, const int *indices,
                         int num_indices, double *params) {
  const int n = 4;    // Size of least-squares problem
  double mat[4 * 4];  // Accumulator for A'A
  double y[4];        // Accumulator for A'b
  double a[4];        // Single row of A
  double b;           // Single element of b

  least_squares_init(mat, y, n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0] = 1;
    a[1] = 0;
    a[2] = sx;
    a[3] = sy;
    b = dx;
    least_squares_accumulate(mat, y, a, b, n);

    a[0] = 0;
    a[1] = 1;
    a[2] = sy;
    a[3] = -sx;
    b = dy;
    least_squares_accumulate(mat, y, a, b, n);
  }

  // Fill in params[0] .. params[3] with output model
  if (!least_squares_solve(mat, y, params, n)) {
    return false;
  }

  // Fill in remaining parameters
  params[4] = -params[3];
  params[5] = params[2];

  return true;
}